

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::setVisible(QWidgetPrivate *this,bool visible)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  QWidget *this_00;
  QObject *pQVar4;
  long lVar5;
  QLayout *this_01;
  Type TVar6;
  QDebug *pQVar7;
  QWidget *pQVar8;
  QWidgetData *pQVar9;
  QEvent *this_02;
  QWidgetPrivate *d;
  uint uVar10;
  QFlagsStorage<Qt::WindowState> newstate;
  long *plVar11;
  long in_FS_OFFSET;
  WidgetAttributes local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 local_74;
  char *local_70;
  QDebug local_60;
  Stream *local_58;
  undefined1 local_50 [8];
  QDebug local_48;
  anon_unknown_dwarf_27bb4f local_40 [8];
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_88 = 2;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    uStack_78 = 0;
    local_74 = 0;
    local_70 = QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    pQVar7 = QDebug::operator<<(&local_60,"Setting visibility of");
    local_58 = pQVar7->stream;
    *(int *)(local_58 + 0x28) = *(int *)(local_58 + 0x28) + 1;
    ::operator<<((Stream *)local_50,(QWidget *)&local_58);
    pQVar7 = QDebug::operator<<((QDebug *)local_50,"with attributes");
    local_48.stream = pQVar7->stream;
    *(int *)(local_48.stream + 0x28) = *(int *)(local_48.stream + 0x28) + 1;
    local_90.widget = this_00;
    anon_unknown.dwarf_27bb4f::operator<<(local_40,&local_48,&local_90);
    pQVar7 = QDebug::operator<<((QDebug *)local_40,"to");
    pQVar7 = QDebug::operator<<(pQVar7,visible);
    QDebug::operator<<(pQVar7,"via QWidgetPrivate");
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug((QDebug *)local_50);
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug(&local_60);
  }
  if (!visible) {
    if (QApplicationPrivate::hidden_focus_widget == this_00) {
      QApplicationPrivate::hidden_focus_widget = (QWidget *)0x0;
    }
    pQVar9 = this_00->data;
    if ((((pQVar9->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
       (lVar5 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar5 != 0)) {
      setDirtyOpaqueRegion(*(QWidgetPrivate **)(lVar5 + 8));
      pQVar9 = this_00->data;
    }
    if ((pQVar9->widget_attributes & 0x10000) == 0) {
      QWidget::setAttribute(this_00,WA_WState_Hidden,true);
      hide_helper(this);
      pQVar9 = this_00->data;
    }
    if ((((pQVar9->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
       (pQVar4 = *(QObject **)(*(long *)&this_00->field_0x8 + 0x10), pQVar4 != (QObject *)0x0)) {
      if (*(long **)(*(long *)(pQVar4 + 8) + 0x98) == (long *)0x0) {
        if ((*(byte *)(*(long *)(pQVar4 + 0x20) + 9) & 0x80) != 0) {
          this_02 = (QEvent *)operator_new(0x10);
          QEvent::QEvent(this_02,LayoutRequest);
          QCoreApplication::postEvent(pQVar4,this_02,0);
        }
      }
      else {
        (**(code **)(**(long **)(*(long *)(pQVar4 + 8) + 0x98) + 0x70))();
      }
    }
    TVar6 = HideToParent;
    goto LAB_002fed2a;
  }
  pQVar9 = this_00->data;
  if ((((((pQVar9->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
       (pQVar8 = *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10), pQVar8 != (QWidget *)0x0)) &&
      ((pQVar8->data->widget_attributes & 0x8000) != 0)) &&
     ((*(byte *)(*(long *)&pQVar8->field_0x8 + 0x243) & 0x10) == 0)) {
    pQVar8 = QWidget::window(pQVar8);
    createRecursively(*(QWidgetPrivate **)&pQVar8->field_0x8);
    pQVar9 = this_00->data;
  }
  uVar10 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
  if (((uVar10 >> 0x1c & 1) == 0) &&
     ((((pQVar9->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0 ||
      ((*(byte *)(*(long *)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8) + 0x243) & 0x10) !=
       0)))) {
    QWidget::create(this_00,0,false,false);
    pQVar9 = this_00->data;
    uVar10 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
  }
  uVar2 = *(uint *)&pQVar9->field_0x10;
  QWidget::ensurePolished(this_00);
  if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    uVar3 = this_00->data->widget_attributes;
    QWidget::setAttribute(this_00,WA_WState_Hidden,false);
    if ((uVar3 >> 0x10 & 1) != 0) {
      updateGeometry_helper(this,true);
    }
  }
  else {
    QWidget::setAttribute(this_00,WA_WState_Hidden,false);
  }
  if (this->layout != (QLayout *)0x0) {
    QLayout::activate(this->layout);
  }
  puVar1 = &this_00->field_0x8;
  plVar11 = (long *)puVar1;
  if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    do {
      lVar5 = *(long *)(*plVar11 + 0x10);
      if (lVar5 == 0) goto LAB_002fec2f;
      if ((((*(byte *)(*(long *)(lVar5 + 0x20) + 9) & 0x80) == 0) ||
          (this_01 = *(QLayout **)(*(long *)(lVar5 + 8) + 0x98), this_01 == (QLayout *)0x0)) ||
         ((*(byte *)(*(long *)(lVar5 + 0x20) + 0x11) & 4) != 0)) break;
      QLayout::activate(this_01);
      plVar11 = (long *)(lVar5 + 8);
    } while ((*(byte *)(*(long *)(lVar5 + 0x20) + 0xc) & 1) == 0);
    setDirtyOpaqueRegion(*(QWidgetPrivate **)(lVar5 + 8));
  }
LAB_002fec2f:
  if ((uVar10 >> 10 & 1) == 0) {
    if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      if (*(long *)(*(long *)(*(long *)(*(long *)puVar1 + 0x10) + 8) + 0x98) != 0)
      goto LAB_002fec91;
      QWidget::adjustSize(this_00);
    }
    else {
      newstate.i = uVar2 & 0xf;
      QWidget::adjustSize(this_00);
      if ((*(uint *)&this_00->data->field_0x10 & 0xf) != newstate.i) {
        QWidget::setWindowState(this_00,(WindowStates)newstate.i);
      }
    }
    QWidget::setAttribute(this_00,WA_Resized,false);
  }
LAB_002fec91:
  QWidget::setAttribute(this_00,WA_KeyboardFocusChange,false);
  if ((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) ||
     ((*(byte *)(*(long *)(*(long *)(*(long *)puVar1 + 0x10) + 0x20) + 9) & 0x80) != 0)) {
    show_helper(this);
    QApplicationPrivate::sendSyntheticEnterLeave
              (*(QApplicationPrivate **)(QCoreApplication::self + 8),this_00);
  }
  TVar6 = ShowToParent;
LAB_002fed2a:
  uStack_7c = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_88,TVar6);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_88);
  QEvent::~QEvent((QEvent *)&local_88);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setVisible(bool visible)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Setting visibility of" << q
                              << "with attributes" << WidgetAttributes{q}
                              << "to" << visible << "via QWidgetPrivate";

    if (visible) { // show
        // Designer uses a trick to make grabWidget work without showing
        if (!q->isWindow() && q->parentWidget() && q->parentWidget()->isVisible()
            && !q->parentWidget()->testAttribute(Qt::WA_WState_Created))
            q->parentWidget()->window()->d_func()->createRecursively();

        //create toplevels but not children of non-visible parents
        QWidget *pw = q->parentWidget();
        if (!q->testAttribute(Qt::WA_WState_Created)
            && (q->isWindow() || pw->testAttribute(Qt::WA_WState_Created))) {
            q->create();
        }

        bool wasResized = q->testAttribute(Qt::WA_Resized);
        Qt::WindowStates initialWindowState = q->windowState();

        // polish if necessary
        q->ensurePolished();

        // whether we need to inform the parent widget immediately
        bool needUpdateGeometry = !q->isWindow() && q->testAttribute(Qt::WA_WState_Hidden);
        // we are no longer hidden
        q->setAttribute(Qt::WA_WState_Hidden, false);

        if (needUpdateGeometry)
            updateGeometry_helper(true);

        // activate our layout before we and our children become visible
        if (layout)
            layout->activate();

        if (!q->isWindow()) {
            QWidget *parent = q->parentWidget();
            while (parent && parent->isVisible() && parent->d_func()->layout  && !parent->data->in_show) {
                parent->d_func()->layout->activate();
                if (parent->isWindow())
                    break;
                parent = parent->parentWidget();
            }
            if (parent)
                parent->d_func()->setDirtyOpaqueRegion();
        }

        // adjust size if necessary
        if (!wasResized
            && (q->isWindow() || !q->parentWidget()->d_func()->layout))  {
            if (q->isWindow()) {
                q->adjustSize();
                if (q->windowState() != initialWindowState)
                    q->setWindowState(initialWindowState);
            } else {
                q->adjustSize();
            }
            q->setAttribute(Qt::WA_Resized, false);
        }

        q->setAttribute(Qt::WA_KeyboardFocusChange, false);

        if (q->isWindow() || q->parentWidget()->isVisible()) {
            show_helper();

            qApp->d_func()->sendSyntheticEnterLeave(q);
        }

        QEvent showToParentEvent(QEvent::ShowToParent);
        QCoreApplication::sendEvent(q, &showToParentEvent);
    } else { // hide
        if (QApplicationPrivate::hidden_focus_widget == q)
            QApplicationPrivate::hidden_focus_widget = nullptr;

        // hw: The test on getOpaqueRegion() needs to be more intelligent
        // currently it doesn't work if the widget is hidden (the region will
        // be clipped). The real check should be testing the cached region
        // (and dirty flag) directly.
        if (!q->isWindow() && q->parentWidget()) // && !d->getOpaqueRegion().isEmpty())
            q->parentWidget()->d_func()->setDirtyOpaqueRegion();

        if (!q->testAttribute(Qt::WA_WState_Hidden)) {
            q->setAttribute(Qt::WA_WState_Hidden);
            hide_helper();
        }

        // invalidate layout similar to updateGeometry()
        if (!q->isWindow() && q->parentWidget()) {
            if (q->parentWidget()->d_func()->layout)
                q->parentWidget()->d_func()->layout->invalidate();
            else if (q->parentWidget()->isVisible())
                QCoreApplication::postEvent(q->parentWidget(), new QEvent(QEvent::LayoutRequest));
        }

        QEvent hideToParentEvent(QEvent::HideToParent);
        QCoreApplication::sendEvent(q, &hideToParentEvent);
    }
}